

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementSpring.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementSpring::GetStateBlock(ChElementSpring *this,ChVectorDynamic<> *mD)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  Index index_1;
  ulong uVar4;
  Index index;
  ulong uVar5;
  double *pdVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar3 = (*(this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase[3])();
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar3);
  uVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar4 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (uVar4 == 0) goto LAB_006982a7;
  pdVar6 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  memset(pdVar6,0,uVar4 * 8);
  if (uVar4 < 3) goto LAB_006982a7;
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 3;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (((ulong)pdVar6 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar5 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00698215;
  }
  else {
LAB_00698215:
    uVar8 = 0;
    do {
      pdVar6[uVar8] = *(double *)(&(peVar2->super_ChNodeFEAbase).field_0x20 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  if (uVar5 < 3) {
    do {
      pdVar6[uVar5] = *(double *)(&(peVar2->super_ChNodeFEAbase).field_0x20 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
  }
  if ((long)uVar4 < 6) {
LAB_006982a7:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  peVar2 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar6 = pdVar6 + 3;
  uVar4 = 3;
  if (((ulong)pdVar6 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar4 = (ulong)uVar7;
    }
    if (uVar7 == 0) goto LAB_00698287;
  }
  uVar5 = 0;
  do {
    pdVar6[uVar5] = *(double *)(&(peVar2->super_ChNodeFEAbase).field_0x20 + uVar5 * 8);
    uVar5 = uVar5 + 1;
  } while (uVar4 != uVar5);
LAB_00698287:
  if (uVar4 < 3) {
    do {
      pdVar6[uVar4] = *(double *)(&(peVar2->super_ChNodeFEAbase).field_0x20 + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  return;
}

Assistant:

void ChElementSpring::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.setZero(this->GetNdofs());
    mD.segment(0, 3) = this->nodes[0]->GetPos().eigen();
    mD.segment(3, 3) = this->nodes[1]->GetPos().eigen();
}